

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QList<unsigned_short>_>::copyAppend
          (QGenericArrayOps<QList<unsigned_short>_> *this,QList<unsigned_short> *b,
          QList<unsigned_short> *e)

{
  qsizetype *pqVar1;
  QList<unsigned_short> *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QList<unsigned_short>_>).ptr;
    for (; b < e; b = (QList<unsigned_short> *)(&b->d + 1)) {
      QArrayDataPointer<unsigned_short>::QArrayDataPointer
                (&pQVar2[(this->super_QArrayDataPointer<QList<unsigned_short>_>).size].d,&b->d);
      pqVar1 = &(this->super_QArrayDataPointer<QList<unsigned_short>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }